

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O1

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  int iVar2;
  void *__s;
  ulong uVar3;
  undefined4 extraout_var;
  value_type_conflict4 *__val;
  ulong uVar4;
  Enum EVar5;
  ulong uVar6;
  OffsetRange OVar7;
  long local_40;
  Offset buffer_file_offset;
  Offset line_offset;
  
  uVar6 = (ulong)find_line;
  if (uVar6 < (ulong)((long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    OVar7 = GetCachedLine(this,find_line);
    *out_range = OVar7;
    return (Result)Ok;
  }
  __s = operator_new(0x10000);
  memset(__s,0,0x10000);
  if ((this->line_ranges_).
      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->line_ranges_).
      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!line_ranges_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/lexer-source-line-finder.cc"
                  ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
  }
  local_40 = 0;
  uVar3 = (long)(this->line_ranges_).
                super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->line_ranges_).
                super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar3 <= uVar6) {
    if (this->eof_ == false) {
      do {
        _Var1._M_head_impl =
             (this->source_)._M_t.
             super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
             super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
        iVar2 = (*(_Var1._M_head_impl)->_vptr_LexerSource[3])(_Var1._M_head_impl,&local_40);
        if (iVar2 == 1) {
          EVar5 = Error;
          goto LAB_00f5f34b;
        }
        _Var1._M_head_impl =
             (this->source_)._M_t.
             super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
             super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
        iVar2 = (*(_Var1._M_head_impl)->_vptr_LexerSource[4])(_Var1._M_head_impl,__s,0x10000);
        uVar3 = CONCAT44(extraout_var,iVar2);
        if (uVar3 < 0x10000) {
          this->eof_ = true;
        }
        if (__s < (void *)((long)__s + uVar3)) {
          uVar4 = 0;
          do {
            if (*(char *)((long)__s + uVar4) == '\n') {
              buffer_file_offset = (local_40 - (ulong)this->last_cr_) + uVar4;
              std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
              emplace_back<unsigned_long&,unsigned_long&>
                        ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                          *)&this->line_ranges_,&this->next_line_start_,&buffer_file_offset);
              this->next_line_start_ = buffer_file_offset + this->last_cr_ + 1;
            }
            this->last_cr_ = *(char *)((long)__s + uVar4) == '\r';
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        if (this->eof_ != false) {
          buffer_file_offset = uVar3 + local_40;
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&buffer_file_offset);
        }
        uVar3 = (long)(this->line_ranges_).
                      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->line_ranges_).
                      super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        if (uVar6 < uVar3) goto LAB_00f5f332;
      } while (this->eof_ == false);
    }
    if (uVar3 <= uVar6) {
      EVar5 = Error;
      if (this->eof_ == false) {
        __assert_fail("eof_",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/lexer-source-line-finder.cc"
                      ,0x78,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)"
                     );
      }
      goto LAB_00f5f34b;
    }
  }
LAB_00f5f332:
  OVar7 = GetCachedLine(this,find_line);
  *out_range = OVar7;
  EVar5 = Ok;
LAB_00f5f34b:
  operator_delete(__s);
  return (Result)EVar5;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}